

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O3

Real __thiscall
amrex::SplineDistFcnElement2d::dist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *spt)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *t;
  dVar2 = ((x0 - x1) + (x0 - x1) + Dx0 + Dx1) * dVar1 * dVar1 * dVar1 +
          (((x1 - x0) * 3.0 - (Dx0 + Dx0)) - Dx1) * dVar1 * dVar1 + Dx0 * dVar1 + x0;
  spt->vect[0] = dVar2;
  dVar1 = *t;
  dVar1 = ((y0 - y1) + (y0 - y1) + Dy0 + Dy1) * dVar1 * dVar1 * dVar1 +
          (((y1 - y0) * 3.0 - (Dy0 + Dy0)) - Dy1) * dVar1 * dVar1 + Dy0 * dVar1 + y0;
  spt->vect[1] = dVar1;
  dVar2 = dVar2 - pt.vect[0];
  dVar1 = dVar1 - pt.vect[1];
  return SQRT(dVar2 * dVar2 + dVar1 * dVar1);
}

Assistant:

amrex::Real SplineDistFcnElement2d::dist(amrex::RealVect pt,
                           amrex::Real x0, amrex::Real x1,
                           amrex::Real Dx0, amrex::Real Dx1,
                           amrex::Real y0, amrex::Real y1,
                           amrex::Real Dy0, amrex::Real Dy1,
                           amrex::Real& t,
                           amrex::RealVect& spt) const {
  amrex::RealVect delta;
  spt[0] = eval(t, x0, x1, Dx0, Dx1);
  spt[1] = eval(t, y0, y1, Dy0, Dy1);

  delta = spt - pt;

  amrex::Real dist;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1]);

  return dist;
}